

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raytraced_renderer.cpp
# Opt level: O0

void __thiscall
CGL::RaytracedRenderer::raytrace_tile
          (RaytracedRenderer *this,int tile_x,int tile_y,int tile_w,int tile_h)

{
  unsigned_long *puVar1;
  ulong uVar2;
  ulong uVar3;
  reference pvVar4;
  int in_ECX;
  int in_EDX;
  int in_ESI;
  long in_RDI;
  int in_R8D;
  size_t x;
  size_t y;
  size_t num_samples_tile;
  size_t tile_idx_y;
  size_t tile_idx_x;
  size_t tile_end_y;
  size_t tile_end_x;
  size_t tile_start_y;
  size_t tile_start_x;
  size_t h;
  size_t w;
  ulong local_80;
  ulong local_78;
  unsigned_long local_58;
  unsigned_long local_50;
  unsigned_long local_48;
  unsigned_long local_40;
  ulong local_38;
  ulong local_30;
  unsigned_long local_28;
  unsigned_long local_20;
  int local_18;
  int local_10;
  int local_c;
  
  local_20 = *(unsigned_long *)(in_RDI + 0x78);
  local_28 = *(unsigned_long *)(in_RDI + 0x80);
  local_30 = (ulong)in_ESI;
  local_38 = (ulong)in_EDX;
  local_48 = local_30 + (long)in_ECX;
  local_18 = in_R8D;
  local_10 = in_EDX;
  local_c = in_ESI;
  puVar1 = std::min<unsigned_long>(&local_48,&local_20);
  local_40 = *puVar1;
  local_58 = local_38 + (long)local_18;
  puVar1 = std::min<unsigned_long>(&local_58,&local_28);
  local_50 = *puVar1;
  uVar2 = (ulong)(long)local_c / *(ulong *)(in_RDI + 0x138);
  uVar3 = (ulong)(long)local_10 / *(ulong *)(in_RDI + 0x138);
  std::vector<int,_std::allocator<int>_>::operator[]
            ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x50),
             uVar2 + uVar3 * *(long *)(in_RDI + 0x68));
  local_78 = local_38;
  while( true ) {
    if (local_50 <= local_78) {
      pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x50),
                          uVar2 + uVar3 * *(long *)(in_RDI + 0x68));
      *pvVar4 = *pvVar4 + 1;
      CGL::PathTracer::write_to_framebuffer
                (*(ImageBuffer **)(in_RDI + 0x30),in_RDI + 0xe0,local_30,local_38,local_40);
      return;
    }
    if ((*(byte *)(in_RDI + 0x140) & 1) == 0) break;
    for (local_80 = local_30; local_80 < local_40; local_80 = local_80 + 1) {
      CGL::PathTracer::raytrace_pixel(*(ulong *)(in_RDI + 0x30),local_80);
    }
    local_78 = local_78 + 1;
  }
  return;
}

Assistant:

void RaytracedRenderer::raytrace_tile(int tile_x, int tile_y,
                               int tile_w, int tile_h) {
  size_t w = frame_w;
  size_t h = frame_h;

  size_t tile_start_x = tile_x;
  size_t tile_start_y = tile_y;

  size_t tile_end_x = std::min(tile_start_x + tile_w, w);
  size_t tile_end_y = std::min(tile_start_y + tile_h, h);

  size_t tile_idx_x = tile_x / imageTileSize;
  size_t tile_idx_y = tile_y / imageTileSize;
  size_t num_samples_tile = tile_samples[tile_idx_x + tile_idx_y * num_tiles_w];

  for (size_t y = tile_start_y; y < tile_end_y; y++) {
    if (!continueRaytracing) return;
    for (size_t x = tile_start_x; x < tile_end_x; x++) {
      pt->raytrace_pixel(x, y);
    }
  }

  tile_samples[tile_idx_x + tile_idx_y * num_tiles_w] += 1;

  pt->write_to_framebuffer(frameBuffer, tile_start_x, tile_start_y, tile_end_x, tile_end_y);
}